

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O1

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::tryToOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this,
          Expression *oneSide,Expression *otherSide)

{
  Store *pSVar1;
  bool bVar2;
  ulong uVar3;
  address64_t aVar4;
  Literal local_40;
  
  if (oneSide->_id != ConstId) {
    return false;
  }
  Literal::Literal(&local_40,(Literal *)(oneSide + 1));
  uVar3 = Literal::getInteger(&local_40);
  if (uVar3 < 0x400) {
    aVar4 = uVar3 + (this->curr->offset).addr;
    bVar2 = true;
    if (aVar4 < 0x400) goto LAB_009b8bf1;
  }
  bVar2 = false;
  aVar4 = 0;
LAB_009b8bf1:
  Literal::~Literal(&local_40);
  if (!bVar2) {
    return false;
  }
  pSVar1 = this->curr;
  (pSVar1->offset).addr = aVar4;
  pSVar1->ptr = otherSide;
  if (otherSide->_id == ConstId) {
    optimizeConstantPointer(this);
    return true;
  }
  return true;
}

Assistant:

bool tryToOptimizeConstant(Expression* oneSide, Expression* otherSide) {
    if (auto* c = oneSide->dynCast<Const>()) {
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        curr->offset = result.total;
        curr->ptr = otherSide;
        if (curr->ptr->template is<Const>()) {
          optimizeConstantPointer();
        }
        return true;
      }
    }
    return false;
  }